

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void idwpt_per(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int l2;
  int t;
  int n;
  int m;
  int l;
  int i;
  int len_avg;
  double *X_local;
  double *cD_local;
  int len_cA_local;
  double *cA_local;
  wpt_object wt_local;
  
  iVar1 = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
  iVar2 = iVar1 / 2;
  t = -2;
  l2 = -1;
  for (m = 0; m < len_cA + iVar2 + -1; m = m + 1) {
    t = t + 2;
    l2 = l2 + 2;
    X[t] = 0.0;
    X[l2] = 0.0;
    for (n = 0; n < iVar2; n = n + 1) {
      iVar3 = n * 2;
      if ((m - n < 0) || (len_cA <= m - n)) {
        if ((m - n < len_cA) || (len_cA + iVar1 + -1 <= m - n)) {
          if ((m - n < 0) &&
             (iVar4 = m - n, iVar4 != -iVar2 && SBORROW4(iVar4,-iVar2) == iVar4 + iVar2 < 0)) {
            X[t] = wt->wave->lpr[iVar3] * cA[(len_cA + m) - n] +
                   wt->wave->hpr[iVar3] * cD[(len_cA + m) - n] + X[t];
            X[l2] = wt->wave->lpr[iVar3 + 1] * cA[(len_cA + m) - n] +
                    wt->wave->hpr[iVar3 + 1] * cD[(len_cA + m) - n] + X[l2];
          }
        }
        else {
          X[t] = wt->wave->lpr[iVar3] * cA[(m - n) - len_cA] +
                 wt->wave->hpr[iVar3] * cD[(m - n) - len_cA] + X[t];
          X[l2] = wt->wave->lpr[iVar3 + 1] * cA[(m - n) - len_cA] +
                  wt->wave->hpr[iVar3 + 1] * cD[(m - n) - len_cA] + X[l2];
        }
      }
      else {
        X[t] = wt->wave->lpr[iVar3] * cA[m - n] + wt->wave->hpr[iVar3] * cD[m - n] + X[t];
        X[l2] = wt->wave->lpr[iVar3 + 1] * cA[m - n] + wt->wave->hpr[iVar3 + 1] * cD[m - n] + X[l2];
      }
    }
  }
  return;
}

Assistant:

static void idwpt_per(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, l2;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	l2 = len_avg / 2;
	m = -2;
	n = -1;

	for (i = 0; i < len_cA + l2 - 1; ++i) {
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < l2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
			else if ((i - l) >= len_cA && (i - l) < len_cA + len_avg - 1) {
				X[m] += wt->wave->lpr[t] * cA[i - l - len_cA] + wt->wave->hpr[t] * cD[i - l - len_cA];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l - len_cA] + wt->wave->hpr[t + 1] * cD[i - l - len_cA];
			}
			else if ((i - l) < 0 && (i - l) > -l2) {
				X[m] += wt->wave->lpr[t] * cA[len_cA + i - l] + wt->wave->hpr[t] * cD[len_cA + i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[len_cA + i - l] + wt->wave->hpr[t + 1] * cD[len_cA + i - l];
			}
		}
	}
}